

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O0

Vec_Ptr_t * Hop_ManDfsNode(Hop_Man_t *p,Hop_Obj_t *pNode)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Hop_Obj_t *pObj_00;
  int local_2c;
  int i;
  Hop_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Hop_Obj_t *pNode_local;
  Hop_Man_t *p_local;
  
  iVar1 = Hop_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                  ,0x61,"Vec_Ptr_t *Hop_ManDfsNode(Hop_Man_t *, Hop_Obj_t *)");
  }
  vNodes_00 = Vec_PtrAlloc(0x10);
  Hop_ManDfs_rec(pNode,vNodes_00);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Hop_Obj_t *)Vec_PtrEntry(vNodes_00,local_2c);
    Hop_ObjClearMarkA(pObj_00);
  }
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Hop_ManDfsNode( Hop_Man_t * p, Hop_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    assert( !Hop_IsComplement(pNode) );
    vNodes = Vec_PtrAlloc( 16 );
    Hop_ManDfs_rec( pNode, vNodes );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}